

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_PrintBold
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  DObject *this;
  bool bVar2;
  FFont *font;
  char *pcVar3;
  FString text;
  FString formatted;
  FString local_38;
  double local_30;
  FString local_28;
  float local_1c;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_003e3507;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e34f7:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e3507:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc64,
                  "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (DObject *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this != (DObject *)0x0) {
      bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
      if (!bVar2) {
        pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003e3507;
      }
    }
  }
  else if (this != (DObject *)0x0) goto LAB_003e34f7;
  if (numparam == 1) {
    pcVar3 = "(paramnum) < numparam";
LAB_003e352f:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc65,
                  "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x02') {
    pcVar3 = "param[paramnum].Type == REGT_STRING";
    goto LAB_003e352f;
  }
  FString::AttachToOther(&local_38,(FString *)(param + 1));
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e3557;
    }
    local_30 = param[2].field_0.f;
  }
  else {
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar3 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003e3557:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xc66,
                    "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
      ;
    }
    local_30 = param[2].field_0.f;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type == '\0') goto LAB_003e3420;
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e3576;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type == '\0') {
LAB_003e3420:
    iVar1 = param[3].field_0.i;
    local_1c = con_midtime.Value;
    if (*local_38.Chars == '$') {
      pcVar3 = FStringTable::operator()(&GStrings,local_38.Chars + 1);
      FString::operator=(&local_38,pcVar3);
    }
    if (iVar1 == 0) {
      font = (FFont *)0x0;
    }
    else {
      font = V_GetFont(FName::NameData.NameArray[iVar1].Text);
    }
    if (0.0 < local_30) {
      FFloatCVar::operator=(&con_midtime,(float)local_30);
    }
    strbin1((char *)&local_28);
    if (font == (FFont *)0x0) {
      font = SmallFont;
    }
    C_MidPrintBold(font,local_28.Chars);
    FFloatCVar::operator=(&con_midtime,local_1c);
    FString::~FString(&local_28);
    FString::~FString(&local_38);
    return 0;
  }
  pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e3576:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xc67,
                "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PrintBold)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_STRING	(text);
	PARAM_FLOAT_DEF	(time);
	PARAM_NAME_DEF	(fontname);

	float saved = con_midtime;
	FFont *font = NULL;
	
	if (text[0] == '$') text = GStrings(&text[1]);
	if (fontname != NAME_None)
	{
		font = V_GetFont(fontname);
	}
	if (time > 0)
	{
		con_midtime = float(time);
	}
	FString formatted = strbin1(text);
	C_MidPrintBold(font != NULL ? font : SmallFont, formatted.GetChars());
	con_midtime = saved;
	return 0;
}